

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

char * pty_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,Conf *conf,
               char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  Backend *pBVar1;
  char *pcVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined8 auStack_aa8 [161];
  uint local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  LogContext *local_588;
  Seat *local_580;
  char **local_578;
  LogContext *local_570;
  Backend **local_568;
  Seat *local_560;
  undefined8 local_558;
  ssh_ttymodes modes;
  char *cmd;
  _Bool keepalive_local;
  _Bool nodelay_local;
  char *host_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Backend **backend_handle_local;
  Seat *seat_local;
  BackendVtable *vt_local;
  
  bVar6 = 0;
  stack0xffffffffffffffb8 = (char *)0x0;
  local_570 = logctx;
  local_568 = backend_handle;
  local_560 = seat;
  memset(&local_558,0,0x50c);
  if (((pty_argv != (char **)0x0) && (*pty_argv != (char *)0x0)) && (pty_argv[1] == (char *)0x0)) {
    stack0xffffffffffffffb8 = *pty_argv;
  }
  pcVar2 = stack0xffffffffffffffb8;
  if (vt == &pty_backend) {
    local_578 = pty_argv;
    puVar4 = &local_558;
    puVar5 = auStack_aa8;
    local_588 = logctx;
    local_580 = seat;
    for (lVar3 = 0xa1; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    local_5a0 = modes.mode_val[0xff];
    local_590 = 0;
    local_598 = 0;
    pBVar1 = pty_backend_create(local_580,local_588,conf,local_578,pcVar2,0);
    *backend_handle = pBVar1;
    pcVar2 = dupstr("");
    *realhost = pcVar2;
    return (char *)0x0;
  }
  __assert_fail("vt == &pty_backend",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",0x50c
                ,
                "char *pty_init(const BackendVtable *, Seat *, Backend **, LogContext *, Conf *, const char *, int, char **, _Bool, _Bool)"
               );
}

Assistant:

static char *pty_init(const BackendVtable *vt, Seat *seat,
                      Backend **backend_handle, LogContext *logctx,
                      Conf *conf, const char *host, int port,
                      char **realhost, bool nodelay, bool keepalive)
{
    const char *cmd = NULL;
    struct ssh_ttymodes modes;

    memset(&modes, 0, sizeof(modes));

    if (pty_argv && pty_argv[0] && !pty_argv[1])
        cmd = pty_argv[0];

    assert(vt == &pty_backend);
    *backend_handle = pty_backend_create(
        seat, logctx, conf, pty_argv, cmd, modes, false, NULL, NULL);
    *realhost = dupstr("");
    return NULL;
}